

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etw.cpp
# Opt level: O2

void writeEtw(QFile *file,Provider *provider)

{
  uint i;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char16_t *data;
  qsizetype len;
  undefined4 i_00;
  undefined8 uVar5;
  undefined4 uVar6;
  uint uVar7;
  quint64 qVar8;
  Data *pDVar9;
  bool bVar10;
  int iVar11;
  QTextStream *pQVar12;
  char *pcVar13;
  TraceEnum *pTVar14;
  TraceFlags *pTVar15;
  Tracepoint *pTVar16;
  Field *pFVar17;
  FlagValue *pFVar18;
  ulong uVar19;
  EnumValue *l;
  long lVar20;
  EnumValue *args;
  TraceFlags *name;
  Tracepoint *a;
  QString *pQVar21;
  EnumValue *v;
  EnumValue *pEVar22;
  FlagValue *pFVar23;
  int *piVar24;
  EnumValue *v_1;
  Field *field;
  TraceEnum *name_00;
  EnumValue *pEVar25;
  Field *pFVar26;
  int i_01;
  long lVar27;
  uint uVar28;
  int iVar29;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_1b8;
  QTextStream stream;
  QArrayDataPointer<char16_t> local_190;
  QArrayDataPointer<char16_t> local_178;
  QArrayDataPointer<char16_t> local_158;
  QArrayDataPointer<char16_t> local_138;
  undefined1 local_118 [12];
  uint uStack_10c;
  qsizetype local_108;
  quint64 qStack_100;
  undefined1 *local_f8;
  undefined1 *puStack_f0;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  QArrayDataPointer<char16_t> local_b8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  stream.d_ptr._M_t.
  super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
  super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
       (unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QTextStream::QTextStream(&stream,(QIODevice *)file);
  local_1b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_1b8.d._0_4_ = 0xaaaaaaaa;
  local_1b8.d._4_4_ = 0xaaaaaaaa;
  local_1b8.ptr._0_4_ = 0xaaaaaaaa;
  local_1b8.ptr._4_4_ = 0xaaaaaaaa;
  (*(file->super_QFileDevice).super_QIODevice._vptr_QIODevice[0x13])
            ((QArrayDataPointer<char16_t> *)local_118,file);
  QFileInfo::QFileInfo((QFileInfo *)&local_b8,(QString *)local_118);
  QFileInfo::fileName((QString *)&local_1b8,(QFileInfo *)&local_b8);
  QFileInfo::~QFileInfo((QFileInfo *)&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_118);
  writeCommonPrologue(&stream);
  local_138.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_138.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_138.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  providerVar((QString *)&local_138,&provider->name);
  local_158.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_158.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_158.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  includeGuard((QString *)&local_158,(QString *)&local_1b8);
  local_178.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_178.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_178.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toLocal8Bit((QByteArray *)&local_190,&provider->name);
  len = local_190.size;
  data = local_190.ptr;
  local_58.size = (ulong)local_58.size._4_4_ << 0x20;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
  local_118._0_8_ = (Data *)0xefcdab8967452301;
  stack0xfffffffffffffef0 = (QString *)0x1032547698badcfe;
  local_108 = -0x555555553c2d1e10;
  qStack_100 = 0;
  sha1Update((Sha1State *)local_118,(uchar *)&local_58,0x10);
  sha1Update((Sha1State *)local_118,(uchar *)data,len);
  qVar8 = qStack_100;
  uVar19 = qStack_100 * 8;
  local_78.d = (Data *)(uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                        (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                        (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                        (uVar19 & 0xff00) << 0x28 | qStack_100 << 0x3b);
  sha1Update((Sha1State *)local_118,(uchar *)anon_var_dwarf_2c7,1);
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_b8.size = 0;
  uStack_a0 = 0;
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (char16_t *)0x0;
  uVar28 = (uint)qVar8 & 0x3f;
  if (uVar28 < 0x38) {
    uVar19 = (ulong)(0x37 - uVar28);
  }
  else {
    sha1Update((Sha1State *)local_118,(uchar *)&local_b8,(ulong)(uVar28 ^ 0x3f));
    uVar19 = 0x38;
  }
  sha1Update((Sha1State *)local_118,(uchar *)&local_b8,uVar19);
  sha1Update((Sha1State *)local_118,(uchar *)&local_78,8);
  uVar5 = local_118._0_8_;
  puStack_d0 = (undefined1 *)0x0;
  local_c8 = (undefined1 *)0x0;
  puStack_e0 = (undefined1 *)0x0;
  local_d8 = (undefined1 *)0x0;
  puStack_c0 = (undefined1 *)0x0;
  puStack_f0 = (undefined1 *)0x0;
  local_e8 = (undefined1 *)0x0;
  qStack_100 = 0;
  local_f8 = (undefined1 *)0x0;
  i_00 = local_118._0_4_;
  local_58.d = (Data *)CONCAT44((uint)local_118._4_4_ >> 0x18 | (local_118._4_4_ & 0xff0000) >> 8,
                                local_58.d._0_4_);
  pDVar9 = local_58.d;
  uVar6 = local_118._8_4_;
  uVar28 = (uint)local_118._8_4_ >> 0x18;
  uVar1 = local_118._8_4_ & 0xff0000;
  uVar3 = local_118._8_4_ & 0xff00;
  uVar7 = uStack_10c;
  i = uStack_10c >> 0x18;
  uVar2 = uStack_10c & 0xff0000;
  uVar4 = uStack_10c & 0xff00;
  local_58.d._7_1_ = SUB81(local_118._0_8_,4);
  local_58.d._0_6_ = SUB86(pDVar9,0);
  local_58.d = (Data *)(CONCAT17(local_58.d._7_1_,
                                 CONCAT16(SUB81(local_118._0_8_,5),local_58.d._0_6_)) &
                        0xff0fffffffffffff | 0x50000000000000);
  local_178.d = (Data *)0x0;
  local_178.ptr = (char16_t *)0x0;
  local_178.size = 0;
  local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QTextStream::QTextStream((QTextStream *)&local_b8,(QString *)&local_178,(OpenMode)0x3);
  Qt::hex((QTextStream *)&local_b8);
  Qt::showbase((QTextStream *)&local_b8);
  pQVar12 = QTextStream::operator<<((QTextStream *)&local_b8,"(");
  pQVar12 = QTextStream::operator<<(pQVar12,i_00);
  pQVar12 = QTextStream::operator<<(pQVar12,", ");
  pQVar12 = QTextStream::operator<<(pQVar12,SUB82(uVar5,6));
  pQVar12 = QTextStream::operator<<(pQVar12,", ");
  pQVar12 = QTextStream::operator<<(pQVar12,local_58.d._6_2_ << 8 | local_58.d._6_2_ >> 8);
  pQVar12 = QTextStream::operator<<(pQVar12,", ");
  pQVar12 = QTextStream::operator<<(pQVar12,uVar28 & 0x3f | 0x80);
  pQVar12 = QTextStream::operator<<(pQVar12,", ");
  pQVar12 = QTextStream::operator<<(pQVar12,uVar1 >> 0x10);
  pQVar12 = QTextStream::operator<<(pQVar12,", ");
  pQVar12 = QTextStream::operator<<(pQVar12,(uVar3 << 8) >> 0x10);
  pQVar12 = QTextStream::operator<<(pQVar12,", ");
  pQVar12 = QTextStream::operator<<(pQVar12,uVar6 & 0xff);
  pQVar12 = QTextStream::operator<<(pQVar12,", ");
  pQVar12 = QTextStream::operator<<(pQVar12,i);
  pQVar12 = QTextStream::operator<<(pQVar12,", ");
  pQVar12 = QTextStream::operator<<(pQVar12,uVar2 >> 0x10);
  pQVar12 = QTextStream::operator<<(pQVar12,", ");
  pQVar12 = QTextStream::operator<<(pQVar12,(uVar4 << 8) >> 0x10);
  pQVar12 = QTextStream::operator<<(pQVar12,", ");
  pQVar12 = QTextStream::operator<<(pQVar12,uVar7 & 0xff);
  QTextStream::operator<<(pQVar12,")");
  QTextStream::~QTextStream((QTextStream *)&local_b8);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_190);
  pQVar12 = QTextStream::operator<<(&stream,"#ifndef ");
  pQVar12 = QTextStream::operator<<(pQVar12,(QString *)&local_158);
  pQVar12 = QTextStream::operator<<(pQVar12,"\n");
  pQVar12 = QTextStream::operator<<(pQVar12,"#define ");
  pQVar12 = QTextStream::operator<<(pQVar12,(QString *)&local_158);
  pQVar12 = QTextStream::operator<<(pQVar12,"\n");
  pQVar12 = QTextStream::operator<<(pQVar12,"\n");
  pQVar12 = QTextStream::operator<<(pQVar12,"#include <qt_windows.h>\n");
  pQVar12 = QTextStream::operator<<(pQVar12,"#include <TraceLoggingProvider.h>\n");
  QTextStream::operator<<(pQVar12,"\n");
  QTextStream::operator<<
            (&stream,
             "#undef _TlgPragmaUtf8Begin\n#undef _TlgPragmaUtf8End\n#define _TlgPragmaUtf8Begin\n#define _TlgPragmaUtf8End\n"
            );
  QTextStream::operator<<(&stream,"\n");
  pcVar13 = qtHeaders();
  QTextStream::operator<<(&stream,pcVar13);
  QTextStream::operator<<(&stream,"\n");
  if ((provider->prefixText).d.size != 0) {
    QListSpecialMethods<QString>::join
              ((QString *)local_118,(QListSpecialMethods<QString> *)&provider->prefixText,(QChar)0xa
              );
    pQVar12 = QTextStream::operator<<(&stream,(QString *)local_118);
    QTextStream::operator<<(pQVar12,"\n\n");
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_118);
  }
  pQVar12 = QTextStream::operator<<(&stream,"#ifdef TRACEPOINT_DEFINE\n");
  pQVar12 = QTextStream::operator<<(pQVar12,"TRACELOGGING_DEFINE_PROVIDER(");
  pQVar12 = QTextStream::operator<<(pQVar12,(QString *)&local_138);
  pQVar12 = QTextStream::operator<<(pQVar12,", \"");
  pQVar12 = QTextStream::operator<<(pQVar12,&provider->name);
  pQVar12 = QTextStream::operator<<(pQVar12,"\", ");
  pQVar12 = QTextStream::operator<<(pQVar12,(QString *)&local_178);
  QTextStream::operator<<(pQVar12,");\n\n");
  pQVar12 = QTextStream::operator<<(&stream,"static inline void registerProvider()\n");
  pQVar12 = QTextStream::operator<<(pQVar12,"{\n");
  pQVar12 = QTextStream::operator<<(pQVar12,"    TraceLoggingRegister(");
  pQVar12 = QTextStream::operator<<(pQVar12,(QString *)&local_138);
  pQVar12 = QTextStream::operator<<(pQVar12,");\n");
  QTextStream::operator<<(pQVar12,"}\n\n");
  pQVar12 = QTextStream::operator<<(&stream,"static inline void unregisterProvider()\n");
  pQVar12 = QTextStream::operator<<(pQVar12,"{\n");
  pQVar12 = QTextStream::operator<<(pQVar12,"    TraceLoggingUnregister(");
  pQVar12 = QTextStream::operator<<(pQVar12,(QString *)&local_138);
  pQVar12 = QTextStream::operator<<(pQVar12,");\n");
  QTextStream::operator<<(pQVar12,"}\n");
  pQVar12 = QTextStream::operator<<(&stream,"Q_CONSTRUCTOR_FUNCTION(registerProvider)\n");
  QTextStream::operator<<(pQVar12,"Q_DESTRUCTOR_FUNCTION(unregisterProvider)\n\n");
  pQVar12 = QTextStream::operator<<(&stream,"#else\n");
  pQVar12 = QTextStream::operator<<(pQVar12,"TRACELOGGING_DECLARE_PROVIDER(");
  pQVar12 = QTextStream::operator<<(pQVar12,(QString *)&local_138);
  pQVar12 = QTextStream::operator<<(pQVar12,");\n");
  QTextStream::operator<<(pQVar12,"#endif // TRACEPOINT_DEFINE\n\n");
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  if ((provider->tracepoints).d.size != 0) {
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d = (Data *)0x0;
    local_138.d = (Data *)0x0;
    local_138.ptr = (char16_t *)0x0;
    local_b8.ptr = L"TP_%1_PROVIDER";
    local_138.size = 0;
    local_b8.size = 0xe;
    QString::arg<QString,_true>
              ((QString *)local_118,(QString *)&local_b8,&provider->name,0,(QChar)0x20);
    QString::toUpper_helper((QString *)&local_78,(QString *)local_118);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_118);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
    pQVar12 = QTextStream::operator<<(&stream,"#if !defined(");
    pQVar12 = QTextStream::operator<<(pQVar12,(QString *)&local_78);
    pQVar12 = QTextStream::operator<<(pQVar12,") && !defined(TRACEPOINT_DEFINE)\n");
    pQVar12 = QTextStream::operator<<(pQVar12,"#define ");
    pQVar12 = QTextStream::operator<<(pQVar12,(QString *)&local_78);
    pQVar12 = QTextStream::operator<<(pQVar12,"\n");
    pQVar12 = QTextStream::operator<<(pQVar12,"QT_BEGIN_NAMESPACE\n");
    QTextStream::operator<<(pQVar12,"namespace QtPrivate {\n");
    name_00 = (provider->enumerations).d.ptr;
    pTVar14 = name_00 + (provider->enumerations).d.size;
    for (; name_00 != pTVar14; name_00 = name_00 + 1) {
      pQVar12 = QTextStream::operator<<(&stream,"inline QString trace_convert_");
      typeToTypeName((QString *)local_118,&name_00->name);
      pQVar12 = QTextStream::operator<<(pQVar12,(QString *)local_118);
      pQVar12 = QTextStream::operator<<(pQVar12,"(");
      pQVar12 = QTextStream::operator<<(pQVar12,&name_00->name);
      QTextStream::operator<<(pQVar12," val)\n");
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_118);
      QTextStream::operator<<(&stream,"{\n");
      pEVar22 = (name_00->values).d.ptr;
      for (lVar20 = (name_00->values).d.size << 5; lVar20 != 0; lVar20 = lVar20 + -0x20) {
        if (pEVar22->range != 0) {
          pQVar12 = QTextStream::operator<<(&stream,"    if (val >= ");
          pQVar12 = QTextStream::operator<<(pQVar12,pEVar22->value);
          pQVar12 = QTextStream::operator<<(pQVar12," && val <= ");
          pQVar12 = QTextStream::operator<<(pQVar12,pEVar22->range);
          pQVar12 = QTextStream::operator<<(pQVar12,")\n");
          pQVar12 = QTextStream::operator<<(pQVar12,"        return QStringLiteral(\"");
          pQVar12 = QTextStream::operator<<(pQVar12,&pEVar22->name);
          pQVar12 = QTextStream::operator<<(pQVar12," + \") + QString::number((int)val - ");
          pQVar12 = QTextStream::operator<<(pQVar12,pEVar22->value);
          QTextStream::operator<<(pQVar12,");\n");
        }
        pEVar22 = pEVar22 + 1;
      }
      QTextStream::operator<<(&stream,"\n    QString ret;\n    switch (val) {\n");
      local_b8.d = (Data *)0x0;
      local_b8.ptr = (char16_t *)0x0;
      local_b8.size = 0;
      pEVar22 = (name_00->values).d.ptr;
      pEVar25 = pEVar22 + (name_00->values).d.size;
      for (; pEVar22 != pEVar25; pEVar22 = pEVar22 + 1) {
        if (pEVar22->range == 0) {
          piVar24 = &pEVar22->value;
          bVar10 = QListSpecialMethodsBase<int>::contains<int>
                             ((QListSpecialMethodsBase<int> *)&local_b8,piVar24);
          if (!bVar10) {
            pQVar12 = QTextStream::operator<<(&stream,"    case ");
            pQVar12 = QTextStream::operator<<(pQVar12,*piVar24);
            pQVar12 = QTextStream::operator<<(pQVar12,": ret = QStringLiteral(\"");
            iVar11 = *piVar24;
            local_108 = 0;
            local_118._0_8_ = (Data *)0x0;
            stack0xfffffffffffffef0 = (QString *)0x0;
            args = (name_00->values).d.ptr;
            for (lVar20 = (name_00->values).d.size << 5; lVar20 != 0; lVar20 = lVar20 + -0x20) {
              if (args->value == iVar11) {
                QList<QString>::emplaceBack<QString_const&>((QList<QString> *)local_118,&args->name)
                ;
              }
              args = args + 1;
            }
            QListSpecialMethods<QString>::join
                      ((QString *)&local_138,(QListSpecialMethods<QString> *)local_118,(QChar)0x5f);
            QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_118);
            pQVar12 = QTextStream::operator<<(pQVar12,(QString *)&local_138);
            QTextStream::operator<<(pQVar12,"\"); break;\n");
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
            QList<int>::append((QList<int> *)&local_b8,*piVar24);
          }
        }
      }
      QTextStream::operator<<(&stream,"    }\n    return ret;\n}\n");
      QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_b8);
    }
    name = (provider->flags).d.ptr;
    pTVar15 = name + (provider->flags).d.size;
    for (; name != pTVar15; name = name + 1) {
      pQVar12 = QTextStream::operator<<(&stream,"inline QString trace_convert_");
      typeToTypeName((QString *)local_118,&name->name);
      pQVar12 = QTextStream::operator<<(pQVar12,(QString *)local_118);
      pQVar12 = QTextStream::operator<<(pQVar12,"(");
      pQVar12 = QTextStream::operator<<(pQVar12,&name->name);
      QTextStream::operator<<(pQVar12," val)\n");
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_118);
      QTextStream::operator<<(&stream,"{\n    QString ret;\n");
      pFVar23 = (name->values).d.ptr;
      lVar20 = (name->values).d.size;
      lVar27 = 0;
      pFVar18 = pFVar23;
      while( true ) {
        if (lVar20 << 5 == lVar27) goto LAB_00105b05;
        if (pFVar18->value == 0) break;
        pFVar18 = pFVar18 + 1;
        lVar27 = lVar27 + 0x20;
      }
      pQVar12 = QTextStream::operator<<
                          (&stream,"    if (val == 0)\n        return QStringLiteral(\"");
      iVar11 = *(int *)((long)&pFVar23->value + lVar27);
      local_108 = 0;
      local_118._0_8_ = (Data *)0x0;
      stack0xfffffffffffffef0 = (QString *)0x0;
      pFVar23 = (name->values).d.ptr;
      for (lVar20 = (name->values).d.size << 5; lVar20 != 0; lVar20 = lVar20 + -0x20) {
        if (pFVar23->value == iVar11) {
          QList<QString>::emplaceBack<QString_const&>((QList<QString> *)local_118,&pFVar23->name);
        }
        pFVar23 = pFVar23 + 1;
      }
      QListSpecialMethods<QString>::join
                ((QString *)&local_b8,(QListSpecialMethods<QString> *)local_118,(QChar)0x5f);
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_118);
      pQVar12 = QTextStream::operator<<(pQVar12,(QString *)&local_b8);
      QTextStream::operator<<(pQVar12,"\");\n");
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      pFVar23 = (name->values).d.ptr;
      lVar20 = (name->values).d.size;
LAB_00105b05:
      local_108 = 0;
      local_118._0_8_ = (Data *)0x0;
      stack0xfffffffffffffef0 = (QString *)0x0;
      piVar24 = &pFVar23->value;
      for (lVar20 = lVar20 << 5; lVar20 != 0; lVar20 = lVar20 + -0x20) {
        if ((*piVar24 != 0) &&
           (bVar10 = QListSpecialMethodsBase<int>::contains<int>
                               ((QListSpecialMethodsBase<int> *)local_118,piVar24), !bVar10)) {
          pQVar12 = QTextStream::operator<<(&stream,"    if (val & ");
          pQVar12 = QTextStream::operator<<(pQVar12,1 << ((char)*piVar24 - 1U & 0x1f));
          pQVar12 = QTextStream::operator<<
                              (pQVar12,
                               ") { if (ret.length()) ret += QLatin1Char(\'|\'); ret += QStringLiteral(\""
                              );
          pQVar12 = QTextStream::operator<<(pQVar12,(QString *)(piVar24 + -6));
          QTextStream::operator<<(pQVar12,"\"); }\n");
          QList<int>::append((QList<int> *)local_118,*piVar24);
        }
        piVar24 = piVar24 + 8;
      }
      QTextStream::operator<<(&stream,"    return ret;\n}\n");
      QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)local_118);
    }
    a = (provider->tracepoints).d.ptr;
    pTVar16 = a + (provider->tracepoints).d.size;
    for (; a != pTVar16; a = a + 1) {
      local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      formatFunctionSignature((QString *)&local_b8,&a->args);
      local_138.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_138.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_138.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      formatParameterList((QString *)&local_138,provider,&a->args,&a->fields,ETW);
      local_158.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_158.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_158.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char16_t *)0x0;
      local_190.d = (Data *)0x0;
      local_190.ptr = L"TP_%1_%2";
      local_58.size = 0;
      local_190.size = 8;
      QString::arg<QString,_true>
                ((QString *)&local_178,(QString *)&local_190,&provider->name,0,(QChar)0x20);
      QString::arg<QString,_true>((QString *)local_118,(QString *)&local_178,&a->name,0,(QChar)0x20)
      ;
      QString::toUpper_helper((QString *)&local_158,(QString *)local_118);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_118);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_190);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      local_178.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_178.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_178.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      providerVar((QString *)&local_178,&provider->name);
      QTextStream::operator<<(&stream,"\n");
      pQVar12 = QTextStream::operator<<(&stream,"inline void trace_");
      pQVar12 = QTextStream::operator<<(pQVar12,&a->name);
      pQVar12 = QTextStream::operator<<(pQVar12,"(");
      pQVar12 = QTextStream::operator<<(pQVar12,(QString *)&local_b8);
      pQVar12 = QTextStream::operator<<(pQVar12,")\n");
      QTextStream::operator<<(pQVar12,"{\n");
      pQVar21 = &((a->fields).d.ptr)->name;
      for (lVar20 = (a->fields).d.size * 0x58; lVar20 != 0; lVar20 = lVar20 + -0x58) {
        if ((int)pQVar21[-2].d.size == 0x10) {
          pQVar12 = QTextStream::operator<<(&stream,"    const QString ");
          pQVar12 = QTextStream::operator<<(pQVar12,pQVar21);
          pQVar12 = QTextStream::operator<<(pQVar12,"Str = QDebug::toString(");
          pQVar12 = QTextStream::operator<<(pQVar12,pQVar21);
          QTextStream::operator<<(pQVar12,");\n");
        }
        pQVar21 = (QString *)&pQVar21[3].d.size;
      }
      pQVar12 = QTextStream::operator<<(&stream,"    TraceLoggingWrite(");
      pQVar12 = QTextStream::operator<<(pQVar12,(QString *)&local_178);
      pQVar12 = QTextStream::operator<<(pQVar12,", \"");
      pQVar12 = QTextStream::operator<<(pQVar12,&a->name);
      QTextStream::operator<<(pQVar12,"\"");
      pFVar26 = (a->fields).d.ptr;
      pFVar17 = pFVar26 + (a->fields).d.size;
      for (; pFVar26 != pFVar17; pFVar26 = pFVar26 + 1) {
        QTextStream::operator<<(&stream,",\n");
        QTextStream::operator<<(&stream,"        ");
        pQVar21 = &pFVar26->name;
        iVar11 = pFVar26->arrayLen;
        if (0 < iVar11) {
          for (iVar29 = 1; i_01 = iVar29 + -1, i_01 < iVar11; iVar29 = iVar29 + 1) {
            pQVar12 = QTextStream::operator<<(&stream,"TraceLoggingValue(");
            pQVar12 = QTextStream::operator<<(pQVar12,pQVar21);
            pQVar12 = QTextStream::operator<<(pQVar12,"[");
            pQVar12 = QTextStream::operator<<(pQVar12,i_01);
            pQVar12 = QTextStream::operator<<(pQVar12,"], \"");
            pQVar12 = QTextStream::operator<<(pQVar12,pQVar21);
            pQVar12 = QTextStream::operator<<(pQVar12,"[");
            pQVar12 = QTextStream::operator<<(pQVar12,i_01);
            QTextStream::operator<<(pQVar12,"]\")");
            iVar11 = pFVar26->arrayLen;
            if (iVar29 < iVar11) {
              QTextStream::operator<<(&stream,",\n        ");
              iVar11 = pFVar26->arrayLen;
            }
          }
          goto LAB_001061d0;
        }
        switch(pFVar26->backendType) {
        case Pointer:
          pcVar13 = "TraceLoggingPointer(";
          goto LAB_00106197;
        case QtString:
          pQVar12 = QTextStream::operator<<
                              (&stream,"TraceLoggingCountedWideString(reinterpret_cast<LPCWSTR>(");
          pQVar12 = QTextStream::operator<<(pQVar12,pQVar21);
          pQVar12 = QTextStream::operator<<(pQVar12,".utf16()), static_cast<ULONG>(");
          pQVar12 = QTextStream::operator<<(pQVar12,pQVar21);
          pcVar13 = ".size()), \"";
          break;
        case QtByteArray:
          pQVar12 = QTextStream::operator<<(&stream,"TraceLoggingBinary(");
          pQVar12 = QTextStream::operator<<(pQVar12,pQVar21);
          pQVar12 = QTextStream::operator<<(pQVar12,".constData(), ");
          pQVar12 = QTextStream::operator<<(pQVar12,pQVar21);
          pcVar13 = ".size(), \"";
          break;
        case QtUrl:
          pQVar12 = QTextStream::operator<<(&stream,"TraceLoggingValue(");
          pQVar12 = QTextStream::operator<<(pQVar12,pQVar21);
          pcVar13 = ".toEncoded().constData(), \"";
          break;
        case QtRect:
        case QtRectF:
          pQVar12 = QTextStream::operator<<(&stream,"TraceLoggingValue(");
          pQVar12 = QTextStream::operator<<(pQVar12,pQVar21);
          pQVar12 = QTextStream::operator<<(pQVar12,".x(), \"x\"), ");
          pQVar12 = QTextStream::operator<<(pQVar12,"TraceLoggingValue(");
          pQVar12 = QTextStream::operator<<(pQVar12,pQVar21);
          pQVar12 = QTextStream::operator<<(pQVar12,".y(), \"y\"), ");
          goto LAB_0010604b;
        case QtSize:
        case QtSizeF:
          pQVar12 = &stream;
LAB_0010604b:
          pQVar12 = QTextStream::operator<<(pQVar12,"TraceLoggingValue(");
          pQVar12 = QTextStream::operator<<(pQVar12,pQVar21);
          pQVar12 = QTextStream::operator<<(pQVar12,".width(), \"width\"), ");
          pQVar12 = QTextStream::operator<<(pQVar12,"TraceLoggingValue(");
          pQVar12 = QTextStream::operator<<(pQVar12,pQVar21);
          pcVar13 = ".height(), \"height\")";
          goto LAB_001061cb;
        case EnumeratedType:
        case FlagType:
          pQVar12 = QTextStream::operator<<(&stream,"TraceLoggingString(trace_convert_");
          typeToTypeName((QString *)local_118,&pFVar26->paramType);
          pQVar12 = QTextStream::operator<<(pQVar12,(QString *)local_118);
          pQVar12 = QTextStream::operator<<(pQVar12,"(");
          pQVar12 = QTextStream::operator<<(pQVar12,pQVar21);
          pQVar12 = QTextStream::operator<<(pQVar12,").toUtf8().constData(), \"");
          pQVar12 = QTextStream::operator<<(pQVar12,pQVar21);
          QTextStream::operator<<(pQVar12,"\")");
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_118);
          goto LAB_001061d0;
        case Unknown:
          pQVar12 = QTextStream::operator<<
                              (&stream,"TraceLoggingCountedWideString(reinterpret_cast<LPCWSTR>(");
          pQVar12 = QTextStream::operator<<(pQVar12,pQVar21);
          pQVar12 = QTextStream::operator<<(pQVar12,"Str.utf16()), static_cast<ULONG>(");
          pQVar12 = QTextStream::operator<<(pQVar12,pQVar21);
          pcVar13 = "Str.size()), \"";
          break;
        default:
          pcVar13 = "TraceLoggingValue(";
LAB_00106197:
          pQVar12 = QTextStream::operator<<(&stream,pcVar13);
          pQVar12 = QTextStream::operator<<(pQVar12,pQVar21);
          pcVar13 = ", \"";
        }
        pQVar12 = QTextStream::operator<<(pQVar12,pcVar13);
        pQVar12 = QTextStream::operator<<(pQVar12,pQVar21);
        pcVar13 = "\")";
LAB_001061cb:
        QTextStream::operator<<(pQVar12,pcVar13);
LAB_001061d0:
      }
      pQVar12 = QTextStream::operator<<(&stream,");\n");
      QTextStream::operator<<(pQVar12,"}\n\n");
      pQVar12 = QTextStream::operator<<(&stream,"inline void do_trace_");
      pQVar12 = QTextStream::operator<<(pQVar12,&a->name);
      pQVar12 = QTextStream::operator<<(pQVar12,"(");
      pQVar12 = QTextStream::operator<<(pQVar12,(QString *)&local_b8);
      pQVar12 = QTextStream::operator<<(pQVar12,")\n");
      pQVar12 = QTextStream::operator<<(pQVar12,"{\n");
      pQVar12 = QTextStream::operator<<(pQVar12,"    trace_");
      pQVar12 = QTextStream::operator<<(pQVar12,&a->name);
      pQVar12 = QTextStream::operator<<(pQVar12,"(");
      pQVar12 = QTextStream::operator<<(pQVar12,(QString *)&local_138);
      pQVar12 = QTextStream::operator<<(pQVar12,");\n");
      QTextStream::operator<<(pQVar12,"}\n");
      pQVar12 = QTextStream::operator<<(&stream,"inline bool trace_");
      pQVar12 = QTextStream::operator<<(pQVar12,&a->name);
      pQVar12 = QTextStream::operator<<(pQVar12,"_enabled()\n");
      pQVar12 = QTextStream::operator<<(pQVar12,"{\n");
      pQVar12 = QTextStream::operator<<(pQVar12,"    return TraceLoggingProviderEnabled(");
      pQVar12 = QTextStream::operator<<(pQVar12,(QString *)&local_178);
      pQVar12 = QTextStream::operator<<(pQVar12,", 0, 0);\n");
      QTextStream::operator<<(pQVar12,"}\n");
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    }
    pQVar12 = QTextStream::operator<<(&stream,"} // namespace QtPrivate\n");
    pQVar12 = QTextStream::operator<<(pQVar12,"QT_END_NAMESPACE\n");
    pQVar12 = QTextStream::operator<<(pQVar12,"#endif // ");
    pQVar12 = QTextStream::operator<<(pQVar12,(QString *)&local_78);
    QTextStream::operator<<(pQVar12,"\n\n");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
  pQVar12 = QTextStream::operator<<(&stream,"\n#endif // ");
  includeGuard((QString *)local_118,(QString *)&local_1b8);
  pQVar12 = QTextStream::operator<<(pQVar12,(QString *)local_118);
  pQVar12 = QTextStream::operator<<(pQVar12,"\n");
  QTextStream::operator<<(pQVar12,"#include <private/qtrace_p.h>\n");
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_118);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1b8);
  QTextStream::~QTextStream(&stream);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void writeEtw(QFile &file, const Provider &provider)
{
    QTextStream stream(&file);

    const QString fileName = QFileInfo(file.fileName()).fileName();

    writePrologue(stream, fileName, provider);
    writeTracepoints(stream, provider);
    writeEpilogue(stream, fileName);
}